

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O2

void __thiscall
dynet::PickBatchElements::forward_dev_impl<dynet::Device_CPU>
          (PickBatchElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  Tensor *this_00;
  pointer puVar1;
  ostream *poVar2;
  invalid_argument *piVar3;
  pointer puVar4;
  uint uVar5;
  ulong uVar6;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_218;
  ulong local_200;
  DefaultDevice *local_1e8;
  undefined1 *local_1e0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_1d8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_1c0;
  ostringstream oss;
  
  if (this->pval == (uint *)0x0) {
    puVar1 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)puVar4 - (long)puVar1 >> 2 != (ulong)(fx->d).bd) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,
                               "In PickBatchElements::forward, number of elements in the passed-in index vector ("
                              );
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,
                               ") did not match number of elements in mini-batch elements in expression (of dimension"
                              );
      poVar2 = operator<<(poVar2,&fx->d);
      std::operator<<(poVar2,")");
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_218);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)puVar4 - (long)puVar1 >> 2);
        uVar5 = uVar5 + 1) {
      this_00 = *(xs->
                 super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      if ((this_00->d).bd <= puVar1[uVar6]) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,
                                 "PickBatchElements::forward_impl requested element ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," from a batch size of ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_218);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      Tensor::tbvec(&local_1c0,this_00);
      _oss = local_1c0.m_data;
      Tensor::tbvec(&local_1d8,fx);
      local_218.m_dimensions.super_array<long,_2>._M_elems[1] =
           local_1d8.m_dimensions.super_array<long,_2>._M_elems[1];
      local_218.m_data = local_1d8.m_data;
      local_218.m_dimensions.super_array<long,_2>._M_elems[0] =
           local_1d8.m_dimensions.super_array<long,_2>._M_elems[0];
      local_1e8 = dev->edevice;
      local_200 = uVar6;
      local_1e0 = (undefined1 *)&local_218;
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator=((TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                   *)&local_1e8,
                  (TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                   *)&oss);
      puVar1 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    Tensor::tbvec(&local_218,
                  *(xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    _oss = local_218.m_data;
    local_1d8._0_16_ = Tensor::tvec(fx);
    local_1c0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_1d8;
    local_1c0.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_1c0,
                (TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                 *)&oss);
  }
  return;
}

Assistant:

void PickBatchElements::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (pval) {
    fx.tvec().device(*dev.edevice) = xs[0]->tbvec().chip<1>(*pval);
  } else {
    DYNET_ASSERT(pvals != nullptr, "Neither single nor vector of elements available in PickBatchElements::forward");
    DYNET_ARG_CHECK(pvals->size() == fx.d.batch_elems(), 
                            "In PickBatchElements::forward, number of elements in the passed-in index vector (" << pvals->size() << ") "
                            "did not match number of elements in mini-batch elements in expression (of dimension" << fx.d << ")");
    for (unsigned b = 0; b < pvals->size(); ++b) {
      DYNET_ARG_CHECK((*pvals)[b] < xs[0]->d.bd,
                              "PickBatchElements::forward_impl requested element " << (*pvals)[b] << " from a batch size of " << xs[0]->d.bd);
      fx.tbvec().chip<1>(b).device(*dev.edevice) = xs[0]->tbvec().chip<1>((*pvals)[b]);
    }
  }
}